

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_cross_vec3(ShaderEvalContext *c)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector<float,_3> local_28;
  VecAccess<float,_4,_3> local_18;
  
  fVar1 = c->in[1].m_data[2];
  uVar2 = *(undefined8 *)c->in[0].m_data;
  uVar3 = *(undefined8 *)(c->in[0].m_data + 1);
  uVar4 = *(undefined8 *)c->in[1].m_data;
  fVar6 = (float)uVar4;
  fVar5 = (float)uVar2;
  fVar7 = (float)((ulong)uVar4 >> 0x20);
  local_28.m_data[0] = fVar5 * fVar6 - fVar1 * (float)uVar3;
  local_28.m_data[1] = (float)((ulong)uVar2 >> 0x20) * fVar7 - fVar6 * (float)((ulong)uVar3 >> 0x20)
  ;
  local_28.m_data[2] = fVar1 * c->in[0].m_data[2] - fVar7 * fVar5;
  local_18.m_vector = &c->color;
  local_18.m_index[0] = 0;
  local_18.m_index[1] = 1;
  local_18.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_18,&local_28);
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }